

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

void Cloud_PrintInfo(CloudManager *dd)

{
  CloudManager *dd_local;
  
  if (dd != (CloudManager *)0x0) {
    printf("The number of unique table nodes allocated = %12d.\n",(ulong)(uint)dd->nNodesAlloc);
    printf("The number of unique table nodes present   = %12d.\n",(ulong)(uint)dd->nNodesCur);
    printf("The number of unique table hits            = %12d.\n",(ulong)(uint)dd->nUniqueHits);
    printf("The number of unique table misses          = %12d.\n",(ulong)(uint)dd->nUniqueMisses);
    printf("The number of unique table steps           = %12d.\n",(ulong)(uint)dd->nUniqueSteps);
    printf("The number of cache hits                   = %12d.\n",(ulong)(uint)dd->nCacheHits);
    printf("The number of cache misses                 = %12d.\n",(ulong)(uint)dd->nCacheMisses);
    printf("The current signature                      = %12d.\n",(ulong)dd->nSignCur);
    printf("The total memory in use                    = %12d.\n",(ulong)(uint)dd->nMemUsed);
  }
  return;
}

Assistant:

void Cloud_PrintInfo( CloudManager * dd )
{
    if ( dd == NULL ) return;
    printf( "The number of unique table nodes allocated = %12d.\n", dd->nNodesAlloc );
    printf( "The number of unique table nodes present   = %12d.\n", dd->nNodesCur );
    printf( "The number of unique table hits            = %12d.\n", dd->nUniqueHits );
    printf( "The number of unique table misses          = %12d.\n", dd->nUniqueMisses );
    printf( "The number of unique table steps           = %12d.\n", dd->nUniqueSteps );
    printf( "The number of cache hits                   = %12d.\n", dd->nCacheHits );
    printf( "The number of cache misses                 = %12d.\n", dd->nCacheMisses );
    printf( "The current signature                      = %12d.\n", dd->nSignCur );
    printf( "The total memory in use                    = %12d.\n", dd->nMemUsed );
}